

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O2

bool __thiscall
ON_UuidList::Write(ON_UuidList *this,ON_BinaryArchive *archive,bool bSortBeforeWrite)

{
  bool bVar1;
  bool bVar2;
  
  bVar2 = false;
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0);
  if (bVar1) {
    if (bSortBeforeWrite) {
      SortHelper(this);
    }
    else {
      PurgeHelper(this);
    }
    bVar1 = ON_BinaryArchive::WriteArray(archive,&this->super_ON_SimpleArray<ON_UUID_struct>);
    bVar2 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    bVar2 = bVar2 && bVar1;
  }
  return bVar2;
}

Assistant:

bool ON_UuidList::Write( 
  class ON_BinaryArchive& archive, 
  bool bSortBeforeWrite 
  ) const
{
  // NOTE:
  // Per bug 101403, this function is called with
  // bSortBeforeWrite = false when writing ON_HistoryRecord::m_descendants[].
  // All other used call this function with bSortBeforeWrite = true.
  bool rc = archive.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 1, 0 );
  if (rc)
  {
    if ( bSortBeforeWrite )
    {
      // clean and sort
      const_cast<ON_UuidList*>(this)->SortHelper();
    }
    else
    {
      // clean
      const_cast<ON_UuidList*>(this)->PurgeHelper();
    }
    rc = archive.WriteArray( *this );
    if ( !archive.EndWrite3dmChunk() )
      rc = false;
  }
  return rc;
}